

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O3

void post_process_1pass(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                       JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                       JDIMENSION out_rows_avail)

{
  jpeg_d_post_controller *pjVar1;
  JDIMENSION JVar2;
  JDIMENSION num_rows;
  JDIMENSION local_2c;
  
  pjVar1 = cinfo->post;
  JVar2 = out_rows_avail - *out_row_ctr;
  if (*(uint *)&pjVar1[2].start_pass <= out_rows_avail - *out_row_ctr) {
    JVar2 = *(uint *)&pjVar1[2].start_pass;
  }
  local_2c = 0;
  (*cinfo->upsample->upsample)
            (cinfo,input_buf,in_row_group_ctr,in_row_groups_avail,
             (JSAMPARRAY)pjVar1[1].post_process_data,&local_2c,JVar2);
  (*cinfo->cquantize->color_quantize)
            (cinfo,(JSAMPARRAY)pjVar1[1].post_process_data,output_buf + *out_row_ctr,local_2c);
  *out_row_ctr = *out_row_ctr + local_2c;
  return;
}

Assistant:

METHODDEF(void)
post_process_1pass (j_decompress_ptr cinfo,
		    JSAMPIMAGE input_buf, JDIMENSION *in_row_group_ctr,
		    JDIMENSION in_row_groups_avail,
		    JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
		    JDIMENSION out_rows_avail)
{
  my_post_ptr post = (my_post_ptr) cinfo->post;
  JDIMENSION num_rows, max_rows;

  /* Fill the buffer, but not more than what we can dump out in one go. */
  /* Note we rely on the upsampler to detect bottom of image. */
  max_rows = out_rows_avail - *out_row_ctr;
  if (max_rows > post->strip_height)
    max_rows = post->strip_height;
  num_rows = 0;
  (*cinfo->upsample->upsample) (cinfo,
		input_buf, in_row_group_ctr, in_row_groups_avail,
		post->buffer, &num_rows, max_rows);
  /* Quantize and emit data. */
  (*cinfo->cquantize->color_quantize) (cinfo,
		post->buffer, output_buf + *out_row_ctr, (int) num_rows);
  *out_row_ctr += num_rows;
}